

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

Interface * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::GetStructure(ProgramInterface *this,GLchar *name)

{
  Interface *pIVar1;
  GLchar *name_local;
  ProgramInterface *this_local;
  
  pIVar1 = findInterfaceByName(&this->m_structures,name);
  return pIVar1;
}

Assistant:

Interface* ProgramInterface::GetStructure(const GLchar* name)
{
	return findInterfaceByName(m_structures, name);
}